

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O3

bool __thiscall wavingz::demod::state_machine::sample_sm_t::idle(sample_sm_t *this)

{
  state_base_t *psVar1;
  char *pcVar2;
  symbol_sm_t *psVar3;
  symbol_sm_t *psVar4;
  symbol_sm_t *psVar5;
  int iVar6;
  symbol_sm_t *psVar7;
  undefined8 *in_RSI;
  bool bVar8;
  
  psVar1 = (this->current_state_m)._M_t.
           super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
           .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
           _M_head_impl;
  if (psVar1 != (state_base_t *)0x0) {
    pcVar2 = *(char **)(psVar1->_vptr_state_base_t[-1] + 8);
    if (pcVar2 == "N7wavingz5demod13state_machine9sample_sm6idle_tE") {
      bVar8 = true;
    }
    else if (*pcVar2 == '*') {
      bVar8 = false;
    }
    else {
      iVar6 = strcmp(pcVar2,"N7wavingz5demod13state_machine9sample_sm6idle_tE");
      bVar8 = iVar6 == 0;
    }
    return bVar8;
  }
  __cxa_bad_typeid();
  psVar1 = (this->current_state_m)._M_t.
           super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
           .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
           _M_head_impl;
  if (psVar1 != (state_base_t *)0x0) {
    pcVar2 = *(char **)(psVar1->_vptr_state_base_t[-1] + 8);
    bVar8 = true;
    if (pcVar2 != "N7wavingz5demod13state_machine9sample_sm10preamble_tE") {
      if (*pcVar2 == '*') {
        bVar8 = pcVar2 == "N7wavingz5demod13state_machine9sample_sm9lead_in_tE";
      }
      else {
        iVar6 = strcmp(pcVar2,"N7wavingz5demod13state_machine9sample_sm10preamble_tE");
        if ((iVar6 != 0) && (pcVar2 != "N7wavingz5demod13state_machine9sample_sm9lead_in_tE")) {
          iVar6 = strcmp(pcVar2,"N7wavingz5demod13state_machine9sample_sm9lead_in_tE");
          bVar8 = iVar6 == 0;
        }
      }
    }
    return bVar8;
  }
  __cxa_bad_typeid();
  psVar3 = (symbol_sm_t *)this->sample_rate;
  psVar7 = (this->sym_sm)._M_data;
  psVar4 = this[1].sym_sm._M_data;
  if ((symbol_sm_t *)((long)psVar7 - (long)psVar3 >> 3) == psVar4) {
    if (psVar7 != psVar3) {
      psVar4 = (symbol_sm_t *)
               (this->current_state_m)._M_t.
               super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
               .
               super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>
               ._M_head_impl;
      if (psVar4 != psVar3) {
        psVar7 = psVar4;
      }
      (this->current_state_m)._M_t.
      super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
      ._M_t.
      super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
      .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
      _M_head_impl = (state_base_t *)&psVar7[-1].current_state_m;
      psVar7[-1].current_state_m._M_t.
      super___uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
      ._M_t.
      super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
      .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_false>.
      _M_head_impl = (state_base_t *)*in_RSI;
      this[1].sample_rate = (size_t)&psVar7[-1].current_state_m;
      return SUB81(psVar7,0);
    }
  }
  else {
    psVar5 = (symbol_sm_t *)
             (this->current_state_m)._M_t.
             super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
             .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>
             ._M_head_impl;
    if (psVar5 != psVar3) {
      psVar7 = psVar5;
    }
    (this->current_state_m)._M_t.
    super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
    .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
    _M_head_impl = (state_base_t *)&psVar7[-1].current_state_m;
    psVar7[-1].current_state_m._M_t.
    super___uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
    .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_false>.
    _M_head_impl = (state_base_t *)*in_RSI;
    this[1].sym_sm._M_data =
         (symbol_sm_t *)((long)&(psVar4->callback).super__Function_base._M_functor + 1);
  }
  return SUB81(psVar7,0);
}

Assistant:

bool idle() { return typeid(*current_state_m.get()) == typeid(sample_sm::idle_t); }